

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O2

opj_image_t * bmptoimage(char *filename,opj_cparameters_t *parameters)

{
  opj_image_comp_t *poVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  OPJ_UINT32 OVar7;
  int iVar8;
  uint uVar9;
  FILE *__stream;
  size_t sVar10;
  byte *pData;
  long lVar11;
  opj_image_t *image;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  char *pcVar15;
  char cVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  byte *pbVar24;
  size_t sStackY_4d0;
  OPJ_UINT32 OVar25;
  ulong local_4a0;
  OPJ_BITMAPINFOHEADER Info_h;
  OPJ_UINT8 *pLUT [3];
  undefined4 auStack_3d0 [2];
  opj_image_cmptparm_t cmptparm [4];
  OPJ_UINT8 lut_B [256];
  OPJ_UINT8 lut_G [256];
  OPJ_UINT8 lut_R [256];
  
  pLUT[0] = lut_R;
  pLUT[1] = lut_G;
  pLUT[2] = lut_B;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    return (opj_image_t *)0x0;
  }
  iVar3 = getc(__stream);
  iVar4 = getc(__stream);
  if ((ushort)((ushort)(iVar4 << 8) | (ushort)iVar3) != 0x4d42) {
    pcVar15 = "Error, not a BMP file!\n";
    sStackY_4d0 = 0x17;
LAB_001082e1:
    fwrite(pcVar15,sStackY_4d0,1,_stderr);
    goto LAB_00108306;
  }
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar5 = getc(__stream);
  iVar3 = getc(__stream);
  iVar4 = getc(__stream);
  iVar6 = getc(__stream);
  Info_h.biSize = 0;
  Info_h.biWidth = 0;
  Info_h.biHeight = 0;
  Info_h.biPlanes = 0;
  Info_h.biBitCount = 0;
  Info_h.biCompression = 0;
  Info_h.biSizeImage = 0;
  Info_h.biXpelsPerMeter = 0;
  Info_h.biYpelsPerMeter = 0;
  Info_h.biClrUsed = 0;
  Info_h.biClrImportant = 0;
  Info_h.biRedMask = 0;
  Info_h.biGreenMask = 0;
  Info_h.biBlueMask = 0;
  Info_h.biAlphaMask = 0;
  Info_h.biColorSpaceType = 0;
  Info_h.biColorSpaceEP[0] = '\0';
  Info_h.biColorSpaceEP[1] = '\0';
  Info_h.biColorSpaceEP[2] = '\0';
  Info_h.biColorSpaceEP[3] = '\0';
  Info_h.biColorSpaceEP[4] = '\0';
  Info_h.biColorSpaceEP[5] = '\0';
  Info_h.biColorSpaceEP[6] = '\0';
  Info_h.biColorSpaceEP[7] = '\0';
  Info_h.biColorSpaceEP[8] = '\0';
  Info_h.biColorSpaceEP[9] = '\0';
  Info_h.biColorSpaceEP[10] = '\0';
  Info_h.biColorSpaceEP[0xb] = '\0';
  Info_h.biColorSpaceEP[0xc] = '\0';
  Info_h.biColorSpaceEP[0xd] = '\0';
  Info_h.biColorSpaceEP[0xe] = '\0';
  Info_h.biColorSpaceEP[0xf] = '\0';
  Info_h.biColorSpaceEP[0x10] = '\0';
  Info_h.biColorSpaceEP[0x11] = '\0';
  Info_h.biColorSpaceEP[0x12] = '\0';
  Info_h.biColorSpaceEP[0x13] = '\0';
  Info_h.biColorSpaceEP[0x14] = '\0';
  Info_h.biColorSpaceEP[0x15] = '\0';
  Info_h.biColorSpaceEP[0x16] = '\0';
  Info_h.biColorSpaceEP[0x17] = '\0';
  Info_h.biColorSpaceEP[0x18] = '\0';
  Info_h.biColorSpaceEP[0x19] = '\0';
  Info_h.biColorSpaceEP[0x1a] = '\0';
  Info_h.biColorSpaceEP[0x1b] = '\0';
  Info_h.biColorSpaceEP[0x1c] = '\0';
  Info_h.biColorSpaceEP[0x1d] = '\0';
  Info_h.biColorSpaceEP[0x1e] = '\0';
  Info_h.biColorSpaceEP[0x1f] = '\0';
  Info_h.biColorSpaceEP[0x20] = '\0';
  Info_h.biColorSpaceEP[0x21] = '\0';
  Info_h.biColorSpaceEP[0x22] = '\0';
  Info_h.biColorSpaceEP[0x23] = '\0';
  Info_h.biRedGamma = 0;
  Info_h.biGreenGamma = 0;
  Info_h.biBlueGamma = 0;
  Info_h.biIntent = 0;
  Info_h.biIccProfileData = 0;
  Info_h.biIccProfileSize = 0;
  Info_h.biReserved = 0;
  OVar7 = getc(__stream);
  Info_h.biSize = OVar7;
  iVar8 = getc(__stream);
  Info_h.biSize = Info_h.biSize | iVar8 << 8;
  iVar8 = getc(__stream);
  Info_h.biSize = Info_h.biSize | iVar8 << 0x10;
  iVar8 = getc(__stream);
  Info_h.biSize = iVar8 << 0x18 | Info_h.biSize;
  if ((((Info_h.biSize < 0x39) && ((0x110010000001000U >> ((ulong)Info_h.biSize & 0x3f) & 1) != 0))
      || (Info_h.biSize == 0x6c)) || (Info_h.biSize == 0x7c)) {
    OVar7 = getc(__stream);
    Info_h.biWidth = OVar7;
    iVar8 = getc(__stream);
    Info_h.biWidth = Info_h.biWidth | iVar8 << 8;
    iVar8 = getc(__stream);
    Info_h.biWidth = Info_h.biWidth | iVar8 << 0x10;
    iVar8 = getc(__stream);
    Info_h.biWidth = Info_h.biWidth | iVar8 << 0x18;
    OVar7 = getc(__stream);
    Info_h.biHeight = OVar7;
    iVar8 = getc(__stream);
    Info_h.biHeight = Info_h.biHeight | iVar8 << 8;
    iVar8 = getc(__stream);
    Info_h.biHeight = Info_h.biHeight | iVar8 << 0x10;
    iVar8 = getc(__stream);
    Info_h.biHeight = Info_h.biHeight | iVar8 << 0x18;
    iVar8 = getc(__stream);
    Info_h.biPlanes = (OPJ_UINT16)iVar8;
    iVar8 = getc(__stream);
    Info_h.biPlanes = Info_h.biPlanes | (ushort)(iVar8 << 8);
    iVar8 = getc(__stream);
    Info_h.biBitCount = (OPJ_UINT16)iVar8;
    iVar8 = getc(__stream);
    Info_h.biBitCount = (ushort)(iVar8 << 8) | Info_h.biBitCount;
    if (Info_h.biBitCount != 0) {
      uVar2 = Info_h.biBitCount;
      if (0x27 < Info_h.biSize) {
        OVar7 = getc(__stream);
        Info_h.biCompression = OVar7;
        iVar8 = getc(__stream);
        Info_h.biCompression = Info_h.biCompression | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biCompression = Info_h.biCompression | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biCompression = Info_h.biCompression | iVar8 << 0x18;
        OVar7 = getc(__stream);
        Info_h.biSizeImage = OVar7;
        iVar8 = getc(__stream);
        Info_h.biSizeImage = Info_h.biSizeImage | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biSizeImage = Info_h.biSizeImage | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biSizeImage = Info_h.biSizeImage | iVar8 << 0x18;
        OVar7 = getc(__stream);
        Info_h.biXpelsPerMeter = OVar7;
        iVar8 = getc(__stream);
        Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar8 << 0x18;
        OVar7 = getc(__stream);
        Info_h.biYpelsPerMeter = OVar7;
        iVar8 = getc(__stream);
        Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar8 << 0x18;
        OVar7 = getc(__stream);
        Info_h.biClrUsed = OVar7;
        iVar8 = getc(__stream);
        Info_h.biClrUsed = Info_h.biClrUsed | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biClrUsed = Info_h.biClrUsed | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biClrUsed = Info_h.biClrUsed | iVar8 << 0x18;
        OVar7 = getc(__stream);
        Info_h.biClrImportant = OVar7;
        iVar8 = getc(__stream);
        Info_h.biClrImportant = Info_h.biClrImportant | iVar8 << 8;
        iVar8 = getc(__stream);
        Info_h.biClrImportant = Info_h.biClrImportant | iVar8 << 0x10;
        iVar8 = getc(__stream);
        Info_h.biClrImportant = Info_h.biClrImportant | iVar8 << 0x18;
        if (0x37 < Info_h.biSize) {
          OVar7 = getc(__stream);
          Info_h.biRedMask = OVar7;
          iVar8 = getc(__stream);
          Info_h.biRedMask = Info_h.biRedMask | iVar8 << 8;
          iVar8 = getc(__stream);
          Info_h.biRedMask = Info_h.biRedMask | iVar8 << 0x10;
          iVar8 = getc(__stream);
          Info_h.biRedMask = Info_h.biRedMask | iVar8 << 0x18;
          if (Info_h.biRedMask == 0) {
            pcVar15 = "Error, invalid red mask value %d\n";
          }
          else {
            OVar7 = getc(__stream);
            Info_h.biGreenMask = OVar7;
            iVar8 = getc(__stream);
            Info_h.biGreenMask = Info_h.biGreenMask | iVar8 << 8;
            iVar8 = getc(__stream);
            Info_h.biGreenMask = Info_h.biGreenMask | iVar8 << 0x10;
            iVar8 = getc(__stream);
            Info_h.biGreenMask = Info_h.biGreenMask | iVar8 << 0x18;
            if (Info_h.biGreenMask == 0) {
              pcVar15 = "Error, invalid green mask value %d\n";
            }
            else {
              OVar7 = getc(__stream);
              Info_h.biBlueMask = OVar7;
              iVar8 = getc(__stream);
              Info_h.biBlueMask = Info_h.biBlueMask | iVar8 << 8;
              iVar8 = getc(__stream);
              Info_h.biBlueMask = Info_h.biBlueMask | iVar8 << 0x10;
              iVar8 = getc(__stream);
              Info_h.biBlueMask = Info_h.biBlueMask | iVar8 << 0x18;
              if (Info_h.biBlueMask != 0) {
                OVar7 = getc(__stream);
                Info_h.biAlphaMask = OVar7;
                iVar8 = getc(__stream);
                Info_h.biAlphaMask = Info_h.biAlphaMask | iVar8 << 8;
                iVar8 = getc(__stream);
                Info_h.biAlphaMask = Info_h.biAlphaMask | iVar8 << 0x10;
                iVar8 = getc(__stream);
                Info_h.biAlphaMask = Info_h.biAlphaMask | iVar8 << 0x18;
                if (0x6b < Info_h.biSize) {
                  OVar7 = getc(__stream);
                  Info_h.biColorSpaceType = OVar7;
                  iVar8 = getc(__stream);
                  Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar8 << 8;
                  iVar8 = getc(__stream);
                  Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar8 << 0x10;
                  iVar8 = getc(__stream);
                  Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar8 << 0x18;
                  sVar10 = fread(Info_h.biColorSpaceEP,1,0x24,__stream);
                  if (sVar10 != 0x24) {
                    pcVar15 = "Error, can\'t  read BMP header\n";
                    sStackY_4d0 = 0x1e;
                    goto LAB_001082e1;
                  }
                  OVar7 = getc(__stream);
                  Info_h.biRedGamma = OVar7;
                  iVar8 = getc(__stream);
                  Info_h.biRedGamma = Info_h.biRedGamma | iVar8 << 8;
                  iVar8 = getc(__stream);
                  Info_h.biRedGamma = Info_h.biRedGamma | iVar8 << 0x10;
                  iVar8 = getc(__stream);
                  Info_h.biRedGamma = Info_h.biRedGamma | iVar8 << 0x18;
                  OVar7 = getc(__stream);
                  Info_h.biGreenGamma = OVar7;
                  iVar8 = getc(__stream);
                  Info_h.biGreenGamma = Info_h.biGreenGamma | iVar8 << 8;
                  iVar8 = getc(__stream);
                  Info_h.biGreenGamma = Info_h.biGreenGamma | iVar8 << 0x10;
                  iVar8 = getc(__stream);
                  Info_h.biGreenGamma = Info_h.biGreenGamma | iVar8 << 0x18;
                  Info_h.biBlueGamma = getc(__stream);
                  iVar8 = getc(__stream);
                  Info_h.biBlueGamma = Info_h.biBlueGamma | iVar8 << 8;
                  iVar8 = getc(__stream);
                  Info_h.biBlueGamma = Info_h.biBlueGamma | iVar8 << 0x10;
                  iVar8 = getc(__stream);
                  Info_h.biBlueGamma = Info_h.biBlueGamma | iVar8 << 0x18;
                  if (0x7b < Info_h.biSize) {
                    Info_h.biIntent = getc(__stream);
                    iVar8 = getc(__stream);
                    Info_h.biIntent = Info_h.biIntent | iVar8 << 8;
                    iVar8 = getc(__stream);
                    Info_h.biIntent = Info_h.biIntent | iVar8 << 0x10;
                    iVar8 = getc(__stream);
                    Info_h.biIntent = Info_h.biIntent | iVar8 << 0x18;
                    Info_h.biIccProfileData = getc(__stream);
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileData = Info_h.biIccProfileData | iVar8 << 8;
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileData = Info_h.biIccProfileData | iVar8 << 0x10;
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileData = Info_h.biIccProfileData | iVar8 << 0x18;
                    OVar7 = getc(__stream);
                    Info_h.biIccProfileSize = OVar7;
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar8 << 8;
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar8 << 0x10;
                    iVar8 = getc(__stream);
                    Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar8 << 0x18;
                    OVar7 = getc(__stream);
                    Info_h.biReserved = OVar7;
                    iVar8 = getc(__stream);
                    Info_h.biReserved = Info_h.biReserved | iVar8 << 8;
                    iVar8 = getc(__stream);
                    Info_h.biReserved = Info_h.biReserved | iVar8 << 0x10;
                    iVar8 = getc(__stream);
                    Info_h.biReserved = Info_h.biReserved | iVar8 << 0x18;
                  }
                }
                goto LAB_0010803e;
              }
              pcVar15 = "Error, invalid blue mask value %d\n";
            }
          }
          goto LAB_001082fd;
        }
LAB_0010803e:
        uVar2 = Info_h.biBitCount;
      }
      if (uVar2 < 9) {
        uVar23 = 0;
        memset(lut_R,0,0x100);
        memset(lut_G,0,0x100);
        memset(lut_B,0,0x100);
        uVar22 = 1 << ((byte)uVar2 & 0x1f);
        if (Info_h.biClrUsed != 0) {
          uVar22 = Info_h.biClrUsed;
        }
        if (0xff < uVar22) {
          uVar22 = 0x100;
        }
        bVar21 = 0;
        for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
          iVar8 = getc(__stream);
          lut_B[uVar23] = (OPJ_UINT8)iVar8;
          iVar8 = getc(__stream);
          lut_G[uVar23] = (OPJ_UINT8)iVar8;
          iVar8 = getc(__stream);
          lut_R[uVar23] = (OPJ_UINT8)iVar8;
          getc(__stream);
          bVar21 = bVar21 | lut_G[uVar23] ^ lut_R[uVar23] | lut_B[uVar23] ^ lut_G[uVar23];
        }
        cVar16 = (bVar21 != 0) * '\x02' + '\x01';
      }
      else {
        cVar16 = (Info_h.biAlphaMask != 0 && Info_h.biCompression == 3) + '\x03';
      }
      if (Info_h.biHeight == 0 || Info_h.biWidth == 0) goto LAB_00108306;
      if ((uint)(0xffffffe0 / (ulong)Info_h.biWidth) < (uint)Info_h.biBitCount) goto LAB_00108306;
      uVar22 = Info_h.biWidth * Info_h.biBitCount + 0x1f >> 3;
      if ((Info_h.biBitCount == 4) && (Info_h.biCompression == 2)) {
        if (0x1ffffffc < Info_h.biWidth) goto LAB_00108306;
        uVar22 = Info_h.biWidth + 3;
      }
      uVar22 = uVar22 & 0x1ffffffc;
      uVar23 = (ulong)uVar22;
      if (((int)((Info_h._8_8_ & 0xffffffff) * uVar23 >> 0x20) != 0) ||
         (pData = (byte *)calloc(1,(Info_h._8_8_ & 0xffffffff) * uVar23), pData == (byte *)0x0))
      goto LAB_00108306;
      fseek(__stream,0,0);
      fseek(__stream,(ulong)(iVar3 << 8 | uVar5 | iVar6 << 0x18 | iVar4 << 0x10),0);
      OVar17 = Info_h.biHeight;
      OVar7 = Info_h.biWidth;
      switch(Info_h._16_8_ & 0xffffffff) {
      case 0:
      case 3:
        uVar5 = Info_h.biHeight * uVar22;
        sVar10 = fread(pData,1,(ulong)uVar5,__stream);
        if (sVar10 == uVar5) goto LAB_0010874e;
        pcVar15 = "\nError: fread return a number of element different from the expected.\n";
        sStackY_4d0 = 0x46;
        break;
      case 1:
        uVar5 = Info_h.biHeight * uVar22;
        local_4a0 = 0;
        uVar12 = 0;
        uVar19 = 0;
        pbVar14 = pData;
LAB_00108381:
        do {
LAB_00108387:
          if (OVar17 <= uVar12) goto switchD_0010858f_caseD_1;
          iVar3 = getc(__stream);
          iVar4 = (int)uVar19;
          if (iVar3 == 0) {
            uVar13 = getc(__stream);
            switch(uVar13) {
            case 0:
              uVar12 = uVar12 + 1;
              pbVar14 = pData + uVar12 * uVar22;
              uVar19 = 0;
              break;
            case 1:
              goto switchD_0010858f_caseD_1;
            case 2:
              iVar3 = getc(__stream);
              if ((iVar3 == -1) || (iVar6 = getc(__stream), iVar6 == -1))
              goto switchD_0010858f_caseD_ffffffff;
              uVar12 = uVar12 + iVar6;
              pbVar14 = pData + (ulong)(uVar12 * uVar22) + (ulong)(uint)(iVar3 + iVar4);
              uVar19 = (ulong)(uint)(iVar3 + iVar4);
              break;
            case 0xffffffff:
              goto switchD_0010858f_caseD_ffffffff;
            default:
              goto switchD_001083ce_default;
            }
            goto LAB_00108387;
          }
          if ((iVar3 == -1) || (iVar6 = getc(__stream), iVar6 == -1))
          goto switchD_0010858f_caseD_ffffffff;
          lVar11 = 0;
          while( true ) {
            pbVar24 = pbVar14 + lVar11;
            iVar8 = (int)lVar11;
            if (((iVar3 <= iVar8) || (OVar7 <= (uint)(iVar8 + iVar4))) || (pData + uVar5 <= pbVar24)
               ) break;
            *pbVar24 = (byte)iVar6;
            lVar11 = lVar11 + 1;
          }
          local_4a0 = (ulong)(uint)((int)local_4a0 + iVar8);
          uVar19 = (ulong)(uint)(iVar4 + iVar8);
          pbVar14 = pbVar24;
        } while( true );
      case 2:
        uVar5 = Info_h.biHeight * uVar22;
        local_4a0 = 0;
        uVar12 = 0;
        uVar13 = 0;
        pbVar14 = pData;
LAB_00108542:
        do {
LAB_00108548:
          if (OVar17 <= uVar12) goto switchD_0010858f_caseD_1;
          iVar3 = getc(__stream);
          if (iVar3 == 0) {
            uVar9 = getc(__stream);
            switch(uVar9) {
            case 0:
              uVar12 = uVar12 + 1;
              pbVar14 = pData + uVar12 * uVar22;
              uVar13 = 0;
              break;
            case 1:
              goto switchD_0010858f_caseD_1;
            case 2:
              iVar3 = getc(__stream);
              if ((iVar3 == -1) || (iVar4 = getc(__stream), iVar4 == -1))
              goto switchD_0010858f_caseD_ffffffff;
              uVar13 = iVar3 + uVar13;
              uVar12 = uVar12 + iVar4;
              pbVar14 = pData + (ulong)(uVar12 * uVar22) + (ulong)uVar13;
              break;
            case 0xffffffff:
              goto switchD_0010858f_caseD_ffffffff;
            default:
              goto switchD_0010858f_default;
            }
            goto LAB_00108548;
          }
          if ((iVar3 == -1) || (uVar9 = getc(__stream), uVar9 == 0xffffffff))
          goto switchD_0010858f_caseD_ffffffff;
          bVar21 = 0;
          lVar11 = 0;
          while( true ) {
            pbVar24 = pbVar14 + lVar11;
            iVar4 = (int)lVar11;
            if (((iVar3 <= iVar4) || (OVar7 <= uVar13 + iVar4)) || (pData + uVar5 <= pbVar24))
            break;
            *pbVar24 = (byte)(uVar9 >> (~bVar21 & 4)) & 0xf;
            lVar11 = lVar11 + 1;
            bVar21 = bVar21 + 4;
          }
          local_4a0 = (ulong)(uint)((int)local_4a0 + iVar4);
          uVar13 = uVar13 + iVar4;
          pbVar14 = pbVar24;
        } while( true );
      default:
        pcVar15 = "Unsupported BMP compression\n";
        sStackY_4d0 = 0x1c;
      }
      goto LAB_00108a49;
    }
    pcVar15 = "Error, invalid biBitCount %d\n";
LAB_001082fd:
    uVar23 = 0;
  }
  else {
    pcVar15 = "Error, unknown BMP header size %d\n";
    uVar23 = (ulong)Info_h.biSize;
  }
  fprintf(_stderr,pcVar15,uVar23);
LAB_00108306:
  fclose(__stream);
  return (opj_image_t *)0x0;
switchD_0010858f_default:
  uVar19 = 0;
  iVar3 = 0;
  while( true ) {
    pbVar24 = pbVar14 + uVar19;
    iVar4 = (int)uVar19;
    if ((((int)uVar9 <= iVar4) || (OVar7 <= uVar13 + iVar4)) || (pData + uVar5 <= pbVar24)) break;
    if (((uVar19 & 1) == 0) && (iVar3 = getc(__stream), iVar3 == -1))
    goto switchD_0010858f_caseD_ffffffff;
    bVar21 = (byte)iVar3 & 0xf;
    if ((uVar19 & 1) == 0) {
      bVar21 = (byte)iVar3 >> 4;
    }
    *pbVar24 = bVar21;
    uVar19 = uVar19 + 1;
  }
  local_4a0 = (local_4a0 & 0xffffffff) + uVar19;
  uVar13 = uVar13 + iVar4;
  pbVar14 = pbVar24;
  if (((uVar9 & 3) - 1 < 2) && (iVar3 = getc(__stream), iVar3 == -1))
  goto switchD_0010858f_caseD_ffffffff;
  goto LAB_00108542;
switchD_001083ce_default:
  lVar11 = 0;
  while( true ) {
    pbVar24 = pbVar14 + lVar11;
    if ((((int)uVar13 <= (int)lVar11) || (OVar7 <= (uint)(iVar4 + (int)lVar11))) ||
       (pData + uVar5 <= pbVar24)) break;
    iVar3 = getc(__stream);
    if (iVar3 == -1) goto switchD_0010858f_caseD_ffffffff;
    *pbVar24 = (byte)iVar3;
    lVar11 = lVar11 + 1;
  }
  local_4a0 = (local_4a0 & 0xffffffff) + lVar11;
  if (((uVar13 & 1) != 0) && (iVar3 = getc(__stream), iVar3 == -1))
  goto switchD_0010858f_caseD_ffffffff;
  uVar19 = uVar19 + lVar11 & 0xffffffff;
  pbVar14 = pbVar24;
  goto LAB_00108381;
switchD_0010858f_caseD_1:
  if ((int)local_4a0 == OVar17 * OVar7) {
LAB_0010874e:
    memset(cmptparm,0,0x90);
    iVar3 = parameters->subsampling_dx;
    iVar4 = parameters->subsampling_dy;
    for (lVar11 = 0x20; lVar11 != 0xb0; lVar11 = lVar11 + 0x24) {
      *(undefined4 *)((long)auStack_3d0 + lVar11) = 8;
      *(undefined4 *)((long)&cmptparm[0].dx + lVar11) = 0;
      *(int *)((long)pLUT + lVar11) = iVar3;
      *(int *)((long)pLUT + lVar11 + 4) = iVar4;
      *(OPJ_UINT32 *)((long)pLUT + lVar11 + 8) = Info_h.biWidth;
      *(OPJ_UINT32 *)((long)pLUT + lVar11 + 0xc) = Info_h.biHeight;
    }
    image = (opj_image_t *)opj_image_create(cVar16,cmptparm,(cVar16 == '\x01') + '\x01');
    if (image == (opj_image_t *)0x0) {
      fclose(__stream);
      free(pData);
      return (opj_image_t *)0x0;
    }
    if (cVar16 == '\x04') {
      image->comps[3].alpha = 1;
    }
    OVar7 = parameters->image_offset_x0;
    image->x0 = OVar7;
    OVar17 = parameters->image_offset_y0;
    image->y0 = OVar17;
    image->x1 = OVar7 + (Info_h.biWidth - 1) * parameters->subsampling_dx + 1;
    image->y1 = (Info_h.biHeight - 1) * parameters->subsampling_dy + OVar17 + 1;
    if (Info_h.biCompression == 0 && Info_h.biBitCount == 0x18) {
      poVar1 = image->comps;
      uVar5 = poVar1->w;
      OVar7 = poVar1->h;
      pbVar14 = pData + (OVar7 - 1) * uVar22;
      lVar11 = 0;
      for (OVar17 = 0; OVar17 != OVar7; OVar17 = OVar17 + 1) {
        lVar11 = (long)(int)lVar11;
        uVar20 = 0;
        for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
          iVar3 = (int)uVar20;
          poVar1->data[lVar11 + uVar19] = (uint)pbVar14[iVar3 + 2];
          poVar1[1].data[lVar11 + uVar19] = (uint)pbVar14[iVar3 + 1];
          poVar1[2].data[lVar11 + uVar19] = (uint)pbVar14[uVar20];
          uVar20 = (ulong)(iVar3 + 3);
        }
        pbVar14 = pbVar14 + -uVar23;
        lVar11 = lVar11 + uVar19;
      }
    }
    else if (((Info_h.biBitCount == 8 && Info_h.biCompression == 0) ||
             (Info_h.biCompression == 1 && Info_h.biBitCount == 8)) ||
            (Info_h.biCompression == 2 && Info_h.biBitCount == 4)) {
      bmp8toimage(pData,uVar22,image,pLUT);
    }
    else {
      if (Info_h.biBitCount == 0x20 && Info_h.biCompression == 0) {
        OVar7 = 0xff0000;
        OVar17 = 0xff00;
        OVar18 = 0xff;
        OVar25 = 0;
      }
      else {
        if (Info_h.biCompression != 3 || Info_h.biBitCount != 0x20) {
          if (Info_h.biBitCount == 0x10 && Info_h.biCompression == 0) {
            OVar7 = 0x1f;
            OVar17 = 0x7c00;
            OVar18 = 0x3e0;
            OVar25 = 0;
          }
          else {
            if ((Info_h.biBitCount != 0x10) || (Info_h.biCompression != 3)) {
              opj_image_destroy(image);
              image = (opj_image_t *)0x0;
              fprintf(_stderr,
                      "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n"
                      ,(ulong)Info_h._8_8_ >> 0x30);
              goto LAB_00108b2c;
            }
            OVar17 = Info_h.biRedMask;
            OVar18 = Info_h.biGreenMask;
            OVar7 = Info_h.biBlueMask;
            if ((Info_h.biRedMask == 0 && Info_h.biGreenMask == 0) && Info_h.biBlueMask == 0) {
              Info_h.biRedMask = 0xf800;
              Info_h.biGreenMask = 0x7e0;
              Info_h.biBlueMask = 0x1f;
              OVar17 = 0xf800;
              OVar18 = 0x7e0;
              OVar7 = 0x1f;
            }
            OVar25 = Info_h.biAlphaMask;
          }
          bmpmask16toimage(pData,uVar22,image,OVar17,OVar18,OVar7,OVar25);
          goto LAB_00108b2c;
        }
        OVar7 = Info_h.biRedMask;
        OVar17 = Info_h.biGreenMask;
        OVar18 = Info_h.biBlueMask;
        if ((Info_h.biRedMask == 0 && Info_h.biGreenMask == 0) && Info_h.biBlueMask == 0) {
          Info_h.biRedMask = 0xff0000;
          Info_h.biGreenMask = 0xff00;
          Info_h.biBlueMask = 0xff;
          OVar7 = 0xff0000;
          OVar17 = 0xff00;
          OVar18 = 0xff;
        }
        OVar25 = Info_h.biAlphaMask;
      }
      bmpmask32toimage(pData,uVar22,image,OVar7,OVar17,OVar18,OVar25);
    }
LAB_00108b2c:
    free(pData);
    fclose(__stream);
    return image;
  }
  pcVar15 = "warning, image\'s actual size does not match advertized one\n";
  sStackY_4d0 = 0x3b;
LAB_00108a49:
  fwrite(pcVar15,sStackY_4d0,1,_stderr);
switchD_0010858f_caseD_ffffffff:
  free(pData);
  goto LAB_00108306;
}

Assistant:

opj_image_t* bmptoimage(const char *filename, opj_cparameters_t *parameters)
{
    opj_image_cmptparm_t cmptparm[4];   /* maximum of 4 components */
    OPJ_UINT8 lut_R[256], lut_G[256], lut_B[256];
    OPJ_UINT8 const* pLUT[3];
    opj_image_t * image = NULL;
    FILE *IN;
    OPJ_BITMAPFILEHEADER File_h;
    OPJ_BITMAPINFOHEADER Info_h;
    OPJ_UINT32 i, palette_len, numcmpts = 1U;
    OPJ_BOOL l_result = OPJ_FALSE;
    OPJ_UINT8* pData = NULL;
    OPJ_UINT32 stride;

    pLUT[0] = lut_R;
    pLUT[1] = lut_G;
    pLUT[2] = lut_B;

    IN = fopen(filename, "rb");
    if (!IN) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return NULL;
    }

    if (!bmp_read_file_header(IN, &File_h)) {
        fclose(IN);
        return NULL;
    }
    if (!bmp_read_info_header(IN, &Info_h)) {
        fclose(IN);
        return NULL;
    }

    /* Load palette */
    if (Info_h.biBitCount <= 8U) {
        memset(&lut_R[0], 0, sizeof(lut_R));
        memset(&lut_G[0], 0, sizeof(lut_G));
        memset(&lut_B[0], 0, sizeof(lut_B));

        palette_len = Info_h.biClrUsed;
        if ((palette_len == 0U) && (Info_h.biBitCount <= 8U)) {
            palette_len = (1U << Info_h.biBitCount);
        }
        if (palette_len > 256U) {
            palette_len = 256U;
        }
        if (palette_len > 0U) {
            OPJ_UINT8 has_color = 0U;
            for (i = 0U; i < palette_len; i++) {
                lut_B[i] = (OPJ_UINT8)getc(IN);
                lut_G[i] = (OPJ_UINT8)getc(IN);
                lut_R[i] = (OPJ_UINT8)getc(IN);
                (void)getc(IN); /* padding */
                has_color |= (lut_B[i] ^ lut_G[i]) | (lut_G[i] ^ lut_R[i]);
            }
            if (has_color) {
                numcmpts = 3U;
            }
        }
    } else {
        numcmpts = 3U;
        if ((Info_h.biCompression == 3) && (Info_h.biAlphaMask != 0U)) {
            numcmpts++;
        }
    }

    if (Info_h.biWidth == 0 || Info_h.biHeight == 0) {
        fclose(IN);
        return NULL;
    }

    if (Info_h.biBitCount > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
        fclose(IN);
        return NULL;
    }
    stride = ((Info_h.biWidth * Info_h.biBitCount + 31U) / 32U) *
             4U; /* rows are aligned on 32bits */
    if (Info_h.biBitCount == 4 &&
            Info_h.biCompression == 2) { /* RLE 4 gets decoded as 8 bits data for now... */
        if (8 > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
            fclose(IN);
            return NULL;
        }
        stride = ((Info_h.biWidth * 8U + 31U) / 32U) * 4U;
    }

    if (stride > ((OPJ_UINT32) - 1) / sizeof(OPJ_UINT8) / Info_h.biHeight) {
        fclose(IN);
        return NULL;
    }
    pData = (OPJ_UINT8 *) calloc(1, sizeof(OPJ_UINT8) * stride * Info_h.biHeight);
    if (pData == NULL) {
        fclose(IN);
        return NULL;
    }
    /* Place the cursor at the beginning of the image information */
    fseek(IN, 0, SEEK_SET);
    fseek(IN, (long)File_h.bfOffBits, SEEK_SET);

    switch (Info_h.biCompression) {
    case 0:
    case 3:
        /* read raw data */
        l_result = bmp_read_raw_data(IN, pData, stride, Info_h.biWidth,
                                     Info_h.biHeight);
        break;
    case 1:
        /* read rle8 data */
        l_result = bmp_read_rle8_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    case 2:
        /* read rle4 data */
        l_result = bmp_read_rle4_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    default:
        fprintf(stderr, "Unsupported BMP compression\n");
        l_result = OPJ_FALSE;
        break;
    }
    if (!l_result) {
        free(pData);
        fclose(IN);
        return NULL;
    }

    /* create the image */
    memset(&cmptparm[0], 0, sizeof(cmptparm));
    for (i = 0; i < 4U; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx   = (OPJ_UINT32)parameters->subsampling_dx;
        cmptparm[i].dy   = (OPJ_UINT32)parameters->subsampling_dy;
        cmptparm[i].w    = Info_h.biWidth;
        cmptparm[i].h    = Info_h.biHeight;
    }

    image = opj_image_create(numcmpts, &cmptparm[0],
                             (numcmpts == 1U) ? OPJ_CLRSPC_GRAY : OPJ_CLRSPC_SRGB);
    if (!image) {
        fclose(IN);
        free(pData);
        return NULL;
    }
    if (numcmpts == 4U) {
        image->comps[3].alpha = 1;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = image->x0 + (Info_h.biWidth  - 1U) * (OPJ_UINT32)
                parameters->subsampling_dx + 1U;
    image->y1 = image->y0 + (Info_h.biHeight - 1U) * (OPJ_UINT32)
                parameters->subsampling_dy + 1U;

    /* Read the data */
    if (Info_h.biBitCount == 24 && Info_h.biCompression == 0) { /*RGB */
        bmp24toimage(pData, stride, image);
    } else if (Info_h.biBitCount == 8 &&
               Info_h.biCompression == 0) { /* RGB 8bpp Indexed */
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 8 && Info_h.biCompression == 1) { /*RLE8*/
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 4 && Info_h.biCompression == 2) { /*RLE4*/
        bmp8toimage(pData, stride, image,
                    pLUT); /* RLE 4 gets decoded as 8 bits data for now */
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask32toimage(pData, stride, image, 0x00FF0000U, 0x0000FF00U, 0x000000FFU,
                         0x00000000U);
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0x00FF0000U;
            Info_h.biGreenMask = 0x0000FF00U;
            Info_h.biBlueMask  = 0x000000FFU;
        }
        bmpmask32toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask16toimage(pData, stride, image, 0x7C00U, 0x03E0U, 0x001FU, 0x0000U);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0xF800U;
            Info_h.biGreenMask = 0x07E0U;
            Info_h.biBlueMask  = 0x001FU;
        }
        bmpmask16toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else {
        opj_image_destroy(image);
        image = NULL;
        fprintf(stderr,
                "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n",
                Info_h.biBitCount);
    }
    free(pData);
    fclose(IN);
    return image;
}